

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnViewPrivate::clicked(QColumnViewPrivate *this,QModelIndex *index)

{
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar1;
  byte bVar2;
  QItemSelectionModel *pQVar3;
  QModelIndex *pQVar4;
  pointer ppQVar5;
  ulong uVar6;
  QAbstractItemView *this_01;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined8 local_58;
  undefined1 *puStack_50;
  QAbstractItemModel *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_48 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (index->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    local_48 = (QAbstractItemModel *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x68))(&local_58,pQVar1,index);
  }
  if ((this->columns).d.size == 0) {
    this_01 = (QAbstractItemView *)0x0;
  }
  else {
    this_01 = (QAbstractItemView *)0x0;
    uVar6 = 0;
    do {
      QAbstractItemView::rootIndex(&local_70,(QAbstractItemView *)(this->columns).d.ptr[uVar6]);
      if ((((local_70.r == (int)local_58) && (local_70.c == local_58._4_4_)) &&
          ((undefined1 *)local_70.i == puStack_50)) && (local_70.m.ptr == local_48)) {
        ppQVar5 = QList<QAbstractItemView_*>::data(&this->columns);
        this_01 = (QAbstractItemView *)ppQVar5[uVar6];
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(this->columns).d.size);
  }
  pQVar3 = QAbstractItemView::selectionModel(this_00);
  if ((pQVar3 != (QItemSelectionModel *)0x0) && (this_01 != (QAbstractItemView *)0x0)) {
    pQVar4 = (QModelIndex *)QAbstractItemView::selectionModel(this_01);
    bVar2 = QItemSelectionModel::isSelected(pQVar4);
    pQVar3 = QAbstractItemView::selectionModel(this_00);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,index,(uint)bVar2 * 2 + 0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewPrivate::clicked(const QModelIndex &index)
{
    Q_Q(QColumnView);
    QModelIndex parent = index.parent();
    QAbstractItemView *columnClicked = nullptr;
    for (int column = 0; column < columns.size(); ++column) {
        if (columns.at(column)->rootIndex() == parent) {
            columnClicked = columns[column];
            break;
        }
    }
    if (q->selectionModel() && columnClicked) {
        QItemSelectionModel::SelectionFlags flags = QItemSelectionModel::Current;
        if (columnClicked->selectionModel()->isSelected(index))
            flags |= QItemSelectionModel::Select;
        q->selectionModel()->setCurrentIndex(index, flags);
    }
}